

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * FxConstant::MakeConstant(PSymbol *sym,FScriptPosition *pos)

{
  anon_union_8_3_e9694d7a_for_PSymbolConstNumeric_3 aVar1;
  PType *pPVar2;
  PClass *pPVar3;
  PInt *pPVar4;
  PFloat *pPVar5;
  int iVar6;
  PSymbolConstNumeric *pPVar7;
  undefined4 extraout_var;
  PClass *pPVar9;
  FxExpression *this;
  char *pcVar10;
  char *message;
  PClass *pPVar8;
  undefined4 extraout_var_00;
  
  pPVar7 = dyn_cast<PSymbolConstNumeric>(&sym->super_DObject);
  pPVar9 = PInt::RegistrationInfo.MyClass;
  if (pPVar7 == (PSymbolConstNumeric *)0x0) {
    pcVar10 = FName::NameData.NameArray[*(int *)&(sym->super_DObject).field_0x24].Text;
    message = "\'%s\' is not a constant\n";
LAB_0068d463:
    this = (FxExpression *)0x0;
    FScriptPosition::Message(pos,2,message,pcVar10);
  }
  else {
    pPVar2 = (pPVar7->super_PSymbolConst).ValueType;
    pPVar8 = (pPVar2->super_DObject).Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar6 = (**(pPVar2->super_DObject)._vptr_DObject)(pPVar2);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar6);
      (pPVar2->super_DObject).Class = pPVar8;
    }
    pPVar3 = PFloat::RegistrationInfo.MyClass;
    if (pPVar8 == pPVar9) {
      this = (FxExpression *)operator_new(0x48);
      iVar6 = (pPVar7->field_0).Value;
      FxExpression::FxExpression(this,pos);
      this->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
      pPVar4 = TypeSInt32;
      this[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
      this->ValueType = (PType *)pPVar4;
      *(int *)&this[1].JumpAddresses.Array = iVar6;
    }
    else {
      pPVar2 = (pPVar7->super_PSymbolConst).ValueType;
      pPVar9 = (pPVar2->super_DObject).Class;
      if (pPVar9 == (PClass *)0x0) {
        iVar6 = (**(pPVar2->super_DObject)._vptr_DObject)(pPVar2);
        pPVar9 = (PClass *)CONCAT44(extraout_var_00,iVar6);
        (pPVar2->super_DObject).Class = pPVar9;
      }
      if (pPVar9 != pPVar3) {
        pcVar10 = FName::NameData.NameArray
                  [*(int *)&(pPVar7->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24].
                  Text;
        message = "Invalid constant \'%s\'\n";
        goto LAB_0068d463;
      }
      this = (FxExpression *)operator_new(0x48);
      aVar1 = pPVar7->field_0;
      FxExpression::FxExpression(this,pos);
      this->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
      pPVar5 = TypeFloat64;
      this[1]._vptr_FxExpression = (_func_int **)TypeFloat64;
      this->ValueType = (PType *)pPVar5;
      this[1].JumpAddresses.Array = (FxJumpStatement **)aVar1;
    }
    this->isresolved = true;
  }
  return this;
}

Assistant:

FxExpression *FxConstant::MakeConstant(PSymbol *sym, const FScriptPosition &pos)
{
	FxExpression *x;
	PSymbolConstNumeric *csym = dyn_cast<PSymbolConstNumeric>(sym);
	if (csym != NULL)
	{
		if (csym->ValueType->IsA(RUNTIME_CLASS(PInt)))
		{
			x = new FxConstant(csym->Value, pos);
		}
		else if (csym->ValueType->IsA(RUNTIME_CLASS(PFloat)))
		{
			x = new FxConstant(csym->Float, pos);
		}
		else
		{
			pos.Message(MSG_ERROR, "Invalid constant '%s'\n", csym->SymbolName.GetChars());
			return NULL;
		}
	}
	else
	{
		pos.Message(MSG_ERROR, "'%s' is not a constant\n", sym->SymbolName.GetChars());
		x = NULL;
	}
	return x;
}